

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Char * getContext(XML_Parser parser)

{
  STRING_POOL *pool;
  XML_Char XVar1;
  DTD *pDVar2;
  NAMED *pNVar3;
  char *pcVar4;
  XML_Bool XVar5;
  char cVar6;
  uint uVar7;
  XML_Char *pXVar8;
  char *pcVar9;
  NAMED **ppNVar10;
  ulong uVar11;
  NAMED **ppNVar12;
  bool bVar13;
  
  pDVar2 = parser->m_dtd;
  bVar13 = (pDVar2->defaultPrefix).binding == (BINDING *)0x0;
  if (bVar13) {
LAB_003fd928:
    ppNVar10 = (pDVar2->prefixes).v;
    ppNVar12 = ppNVar10 + (pDVar2->prefixes).size;
    pool = &parser->m_tempPool;
    while (ppNVar10 != ppNVar12) {
      pNVar3 = *ppNVar10;
      ppNVar10 = ppNVar10 + 1;
      if ((pNVar3 != (NAMED *)0x0) && (pNVar3[1].name != (KEY)0x0)) {
        if (!bVar13) {
          pXVar8 = (parser->m_tempPool).ptr;
          if (pXVar8 == (parser->m_tempPool).end) {
            XVar5 = poolGrow(pool);
            if (XVar5 == '\0') {
              return (XML_Char *)0x0;
            }
            pXVar8 = (parser->m_tempPool).ptr;
          }
          (parser->m_tempPool).ptr = pXVar8 + 1;
          *pXVar8 = '\f';
        }
        cVar6 = *pNVar3->name;
        pcVar4 = pNVar3->name;
        while (cVar6 != '\0') {
          pcVar9 = (parser->m_tempPool).ptr;
          if (pcVar9 == (parser->m_tempPool).end) {
            XVar5 = poolGrow(pool);
            if (XVar5 == '\0') goto LAB_003fdbb2;
            cVar6 = *pcVar4;
            pcVar9 = (parser->m_tempPool).ptr;
          }
          (parser->m_tempPool).ptr = pcVar9 + 1;
          *pcVar9 = cVar6;
          cVar6 = pcVar4[1];
          pcVar4 = pcVar4 + 1;
        }
        pXVar8 = (parser->m_tempPool).ptr;
        if (pXVar8 == (parser->m_tempPool).end) {
          XVar5 = poolGrow(pool);
          if (XVar5 == '\0') {
            return (XML_Char *)0x0;
          }
          pXVar8 = (parser->m_tempPool).ptr;
        }
        (parser->m_tempPool).ptr = pXVar8 + 1;
        *pXVar8 = '=';
        uVar7 = *(int *)(pNVar3[1].name + 0x28) + -1 + (uint)(parser->m_namespaceSeparator == '\0');
        bVar13 = false;
        if (0 < (int)uVar7) {
          uVar11 = 0;
          do {
            pXVar8 = (parser->m_tempPool).ptr;
            if (pXVar8 == (parser->m_tempPool).end) {
              XVar5 = poolGrow(pool);
              if (XVar5 == '\0') goto LAB_003fdbb2;
              pXVar8 = (parser->m_tempPool).ptr;
            }
            XVar1 = *(XML_Char *)(*(long *)(pNVar3[1].name + 0x20) + uVar11);
            (parser->m_tempPool).ptr = pXVar8 + 1;
            *pXVar8 = XVar1;
            uVar11 = uVar11 + 1;
            bVar13 = false;
          } while (uVar7 != uVar11);
        }
      }
    }
    ppNVar12 = (pDVar2->generalEntities).v;
    ppNVar10 = ppNVar12 + (pDVar2->generalEntities).size;
    while (ppNVar12 != ppNVar10) {
      pNVar3 = *ppNVar12;
      ppNVar12 = ppNVar12 + 1;
      if ((pNVar3 != (NAMED *)0x0) && (*(char *)&pNVar3[7].name != '\0')) {
        if (!bVar13) {
          pXVar8 = (parser->m_tempPool).ptr;
          if (pXVar8 == (parser->m_tempPool).end) {
            XVar5 = poolGrow(pool);
            if (XVar5 == '\0') {
              return (XML_Char *)0x0;
            }
            pXVar8 = (parser->m_tempPool).ptr;
          }
          (parser->m_tempPool).ptr = pXVar8 + 1;
          *pXVar8 = '\f';
        }
        cVar6 = *pNVar3->name;
        pcVar4 = pNVar3->name;
        while (bVar13 = false, cVar6 != '\0') {
          pcVar9 = (parser->m_tempPool).ptr;
          if (pcVar9 == (parser->m_tempPool).end) {
            XVar5 = poolGrow(pool);
            if (XVar5 == '\0') {
              return (XML_Char *)0x0;
            }
            cVar6 = *pcVar4;
            pcVar9 = (parser->m_tempPool).ptr;
          }
          (parser->m_tempPool).ptr = pcVar9 + 1;
          *pcVar9 = cVar6;
          cVar6 = pcVar4[1];
          pcVar4 = pcVar4 + 1;
        }
      }
    }
    pXVar8 = (parser->m_tempPool).ptr;
    if (pXVar8 == (parser->m_tempPool).end) {
      XVar5 = poolGrow(pool);
      if (XVar5 == '\0') goto LAB_003fdbb2;
      pXVar8 = (parser->m_tempPool).ptr;
    }
    (parser->m_tempPool).ptr = pXVar8 + 1;
    *pXVar8 = '\0';
    pXVar8 = (parser->m_tempPool).start;
  }
  else {
    pXVar8 = (parser->m_tempPool).ptr;
    if (pXVar8 != (parser->m_tempPool).end) {
LAB_003fd8af:
      (parser->m_tempPool).ptr = pXVar8 + 1;
      *pXVar8 = '=';
      uVar7 = ((pDVar2->defaultPrefix).binding)->uriLen + -1 +
              (uint)(parser->m_namespaceSeparator == '\0');
      if (0 < (int)uVar7) {
        uVar11 = 0;
        do {
          pXVar8 = (parser->m_tempPool).ptr;
          if (pXVar8 == (parser->m_tempPool).end) {
            XVar5 = poolGrow(&parser->m_tempPool);
            if (XVar5 == '\0') goto LAB_003fdbb2;
            pXVar8 = (parser->m_tempPool).ptr;
          }
          XVar1 = ((pDVar2->defaultPrefix).binding)->uri[uVar11];
          (parser->m_tempPool).ptr = pXVar8 + 1;
          *pXVar8 = XVar1;
          uVar11 = uVar11 + 1;
        } while (uVar7 != uVar11);
      }
      goto LAB_003fd928;
    }
    XVar5 = poolGrow(&parser->m_tempPool);
    if (XVar5 != '\0') {
      pXVar8 = (parser->m_tempPool).ptr;
      goto LAB_003fd8af;
    }
LAB_003fdbb2:
    pXVar8 = (XML_Char *)0x0;
  }
  return pXVar8;
}

Assistant:

static const XML_Char *
getContext(XML_Parser parser)
{
  DTD * const dtd = parser->m_dtd;  /* save one level of indirection */
  HASH_TABLE_ITER iter;
  XML_Bool needSep = XML_FALSE;

  if (dtd->defaultPrefix.binding) {
    int i;
    int len;
    if (!poolAppendChar(&parser->m_tempPool, XML_T(ASCII_EQUALS)))
      return NULL;
    len = dtd->defaultPrefix.binding->uriLen;
    if (parser->m_namespaceSeparator)
      len--;
    for (i = 0; i < len; i++) {
      if (!poolAppendChar(&parser->m_tempPool, dtd->defaultPrefix.binding->uri[i])) {
        /* Because of memory caching, I don't believe this line can be
         * executed.
         *
         * This is part of a loop copying the default prefix binding
         * URI into the parser's temporary string pool.  Previously,
         * that URI was copied into the same string pool, with a
         * terminating NUL character, as part of setContext().  When
         * the pool was cleared, that leaves a block definitely big
         * enough to hold the URI on the free block list of the pool.
         * The URI copy in getContext() therefore cannot run out of
         * memory.
         *
         * If the pool is used between the setContext() and
         * getContext() calls, the worst it can do is leave a bigger
         * block on the front of the free list.  Given that this is
         * all somewhat inobvious and program logic can be changed, we
         * don't delete the line but we do exclude it from the test
         * coverage statistics.
         */
        return NULL; /* LCOV_EXCL_LINE */
      }
    }
    needSep = XML_TRUE;
  }

  hashTableIterInit(&iter, &(dtd->prefixes));
  for (;;) {
    int i;
    int len;
    const XML_Char *s;
    PREFIX *prefix = (PREFIX *)hashTableIterNext(&iter);
    if (!prefix)
      break;
    if (!prefix->binding) {
      /* This test appears to be (justifiable) paranoia.  There does
       * not seem to be a way of injecting a prefix without a binding
       * that doesn't get errored long before this function is called.
       * The test should remain for safety's sake, so we instead
       * exclude the following line from the coverage statistics.
       */
      continue; /* LCOV_EXCL_LINE */
    }
    if (needSep && !poolAppendChar(&parser->m_tempPool, CONTEXT_SEP))
      return NULL;
    for (s = prefix->name; *s; s++)
      if (!poolAppendChar(&parser->m_tempPool, *s))
        return NULL;
    if (!poolAppendChar(&parser->m_tempPool, XML_T(ASCII_EQUALS)))
      return NULL;
    len = prefix->binding->uriLen;
    if (parser->m_namespaceSeparator)
      len--;
    for (i = 0; i < len; i++)
      if (!poolAppendChar(&parser->m_tempPool, prefix->binding->uri[i]))
        return NULL;
    needSep = XML_TRUE;
  }


  hashTableIterInit(&iter, &(dtd->generalEntities));
  for (;;) {
    const XML_Char *s;
    ENTITY *e = (ENTITY *)hashTableIterNext(&iter);
    if (!e)
      break;
    if (!e->open)
      continue;
    if (needSep && !poolAppendChar(&parser->m_tempPool, CONTEXT_SEP))
      return NULL;
    for (s = e->name; *s; s++)
      if (!poolAppendChar(&parser->m_tempPool, *s))
        return 0;
    needSep = XML_TRUE;
  }

  if (!poolAppendChar(&parser->m_tempPool, XML_T('\0')))
    return NULL;
  return parser->m_tempPool.start;
}